

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O3

void BrotliZopfliCreateCommands
               (size_t num_bytes,size_t block_start,ZopfliNode *nodes,int *dist_cache,
               size_t *last_insert_len,BrotliEncoderParams *params,Command *commands,
               size_t *num_literals)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  ushort uVar4;
  uint16_t uVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  uint32_t uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  uint16_t *puVar24;
  bool bVar25;
  
  uVar6 = (nodes->u).next;
  if (uVar6 == 0xffffffff) {
    lVar22 = 0;
  }
  else {
    sVar2 = params->stream_offset;
    uVar21 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
    puVar24 = &commands->dist_prefix_;
    lVar12 = 0;
    lVar22 = 0;
    do {
      uVar13 = (ulong)uVar6;
      uVar14 = nodes[lVar22 + uVar13].length;
      uVar18 = nodes[lVar22 + uVar13].dcode_insert_length;
      uVar15 = (ulong)(uVar18 & 0x7ffffff);
      uVar6 = nodes[lVar22 + uVar13].u.next;
      bVar25 = lVar12 == 0;
      lVar12 = lVar12 + -1;
      uVar23 = uVar15;
      if (bVar25) {
        uVar23 = *last_insert_len + uVar15;
        *last_insert_len = 0;
      }
      uVar9 = uVar14 & 0x1ffffff;
      uVar1 = nodes[lVar22 + uVar13].distance;
      iVar16 = uVar9 - (uVar14 >> 0x19);
      uVar17 = iVar16 + 9;
      uVar13 = block_start + sVar2 + lVar22 + uVar15;
      if (uVar21 <= uVar13) {
        uVar13 = uVar21;
      }
      uVar3 = (uVar18 >> 0x1b) - 1;
      if (uVar18 < 0x8000000) {
        uVar3 = uVar1 + 0xf;
      }
      ((Command *)(puVar24 + -7))->insert_len_ = (uint32_t)uVar23;
      *(uint *)(puVar24 + -5) = (uVar17 - uVar14) * 0x2000000 | uVar9;
      uVar11 = (ulong)(params->dist).num_direct_distance_codes;
      uVar19 = uVar11 + 0x10;
      if (uVar3 < uVar19) {
        uVar10 = 0;
        uVar14 = uVar3;
      }
      else {
        uVar10 = (params->dist).distance_postfix_bits;
        bVar8 = (byte)uVar10;
        uVar11 = ((uVar3 - uVar11) + (4L << (bVar8 & 0x3f))) - 0x10;
        uVar14 = 0x1f;
        uVar18 = (uint)uVar11;
        if (uVar18 != 0) {
          for (; uVar18 >> uVar14 == 0; uVar14 = uVar14 - 1) {
          }
        }
        uVar7 = (uVar14 ^ 0xffffffe0) + 0x1f;
        bVar25 = (uVar11 >> ((ulong)uVar7 & 0x3f) & 1) != 0;
        iVar20 = uVar7 - uVar10;
        uVar14 = ((uint)bVar25 + iVar20 * 2 + 0xfffe << (bVar8 & 0x3f)) +
                 (int)uVar19 + (~(-1 << (bVar8 & 0x1f)) & uVar18) | iVar20 * 0x400;
        uVar10 = (uint32_t)(uVar11 - ((ulong)bVar25 + 2 << ((byte)uVar7 & 0x3f)) >> (bVar8 & 0x3f));
      }
      *puVar24 = (uint16_t)uVar14;
      *(uint32_t *)(puVar24 + -3) = uVar10;
      if (uVar23 < 6) {
        uVar19 = uVar23 & 0xffffffff;
      }
      else if (uVar23 < 0x82) {
        uVar18 = 0x1f;
        uVar7 = (uint)(uVar23 - 2);
        if (uVar7 != 0) {
          for (; uVar7 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar19 = (ulong)((int)(uVar23 - 2 >> ((char)(uVar18 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar18 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (uVar23 < 0x842) {
        uVar7 = (uint32_t)uVar23 - 0x42;
        uVar18 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar19 = (ulong)((uVar18 ^ 0xffe0) + 0x2a);
      }
      else {
        uVar19 = 0x15;
        if (0x1841 < uVar23) {
          uVar19 = (ulong)(ushort)(0x17 - (uVar23 < 0x5842));
        }
      }
      if (uVar17 < 10) {
        uVar18 = iVar16 + 7;
      }
      else if (uVar17 < 0x86) {
        uVar17 = iVar16 + 3;
        uVar18 = 0x1f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar18 = (int)((ulong)(long)(int)uVar17 >> ((char)(uVar18 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar18 ^ 0xffffffe0) * 2 + 0x42;
      }
      else {
        uVar18 = 0x17;
        if (uVar17 < 0x846) {
          uVar18 = 0x1f;
          if (iVar16 - 0x3dU != 0) {
            for (; iVar16 - 0x3dU >> uVar18 == 0; uVar18 = uVar18 - 1) {
            }
          }
          uVar18 = (uVar18 ^ 0xffe0) + 0x2c;
        }
      }
      uVar4 = (ushort)uVar18;
      uVar5 = (uVar4 & 7) + ((ushort)uVar19 & 7) * 8;
      if ((((uVar14 & 0x3ff) == 0) && ((ushort)uVar19 < 8)) && (uVar4 < 0x10)) {
        if (7 < uVar4) {
          uVar5 = uVar5 + 0x40;
        }
      }
      else {
        iVar16 = (int)((uVar19 & 0xffff) >> 3) * 3 + ((uVar18 & 0xffff) >> 3);
        uVar5 = uVar5 + ((ushort)(0x520d40 >> ((char)iVar16 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar16 * 0x40 + 0x40;
      }
      puVar24[-1] = uVar5;
      if ((uVar1 <= uVar13) && (uVar3 != 0)) {
        dist_cache[3] = dist_cache[2];
        *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
        *dist_cache = uVar1;
      }
      *num_literals = *num_literals + uVar23;
      lVar22 = lVar22 + uVar15 + (ulong)uVar9;
      puVar24 = puVar24 + 8;
    } while (uVar6 != 0xffffffff);
  }
  *last_insert_len = *last_insert_len + (num_bytes - lVar22);
  return;
}

Assistant:

void BrotliZopfliCreateCommands(const size_t num_bytes,
    const size_t block_start, const ZopfliNode* nodes, int* dist_cache,
    size_t* last_insert_len, const BrotliEncoderParams* params,
    Command* commands, size_t* num_literals) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  size_t pos = 0;
  uint32_t offset = nodes[0].u.next;
  size_t i;
  size_t gap = 0;
  for (i = 0; offset != BROTLI_UINT32_MAX; i++) {
    const ZopfliNode* next = &nodes[pos + offset];
    size_t copy_length = ZopfliNodeCopyLength(next);
    size_t insert_length = next->dcode_insert_length & 0x7FFFFFF;
    pos += insert_length;
    offset = next->u.next;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    {
      size_t distance = ZopfliNodeCopyDistance(next);
      size_t len_code = ZopfliNodeLengthCode(next);
      size_t dictionary_start = BROTLI_MIN(size_t,
          block_start + pos + stream_offset, max_backward_limit);
      BROTLI_BOOL is_dictionary =
          TO_BROTLI_BOOL(distance > dictionary_start + gap);
      size_t dist_code = ZopfliNodeDistanceCode(next);
      InitCommand(&commands[i], &params->dist, insert_length,
          copy_length, (int)len_code - (int)copy_length, dist_code);

      if (!is_dictionary && dist_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = (int)distance;
      }
    }

    *num_literals += insert_length;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
}